

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall icu_63::number::impl::DecimalQuantity::compact(DecimalQuantity *this)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (this->usingBytes == true) {
    iVar2 = this->precision;
    if ((long)iVar2 < 1) {
      lVar10 = 0;
LAB_00216d44:
      if ((int)lVar10 != iVar2) {
        shiftRight(this,(int)lVar10);
        uVar6 = (ulong)(uint)this->precision + 1;
        do {
          if ((int)uVar6 + -1 < 1) {
            this->precision = (int)uVar6 + -1;
            goto LAB_00216d88;
          }
          uVar8 = uVar6 - 1;
          pcVar1 = (char *)(((this->fBCD).bcdLong - 2) + uVar6);
          uVar6 = uVar8;
        } while (*pcVar1 == '\0');
        this->precision = (int32_t)uVar8;
        if (0x10 < uVar8) {
          return;
        }
LAB_00216d88:
        switchStorage(this);
        return;
      }
    }
    else {
      lVar10 = 0;
      do {
        if ((this->fBCD).bcdBytes.ptr[lVar10] != '\0') goto LAB_00216d44;
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
  }
  else {
    uVar6 = (this->fBCD).bcdLong;
    if (uVar6 != 0) {
      uVar3 = this->precision;
      uVar8 = (ulong)uVar3;
      uVar11 = 0;
      if (0 < (int)uVar3) {
        do {
          if ((uVar11 < 0x10) && ((uVar6 >> ((char)uVar11 * '\x04' & 0x3fU) & 0xf) != 0))
          goto LAB_00216ce9;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar8);
        uVar11 = (ulong)uVar3;
      }
LAB_00216ce9:
      uVar6 = uVar6 >> ((char)uVar11 * '\x04' & 0x3fU);
      (this->fBCD).bcdLong = uVar6;
      this->scale = this->scale + (int)uVar11;
      lVar10 = uVar8 * 4 + -4;
      uVar11 = uVar8 - 1;
      do {
        uVar7 = (uint)uVar8;
        uVar9 = (int)uVar3 >> 0x1f & uVar3;
        if ((int)uVar7 < 1) break;
        bVar4 = (byte)lVar10;
        uVar8 = (ulong)(uVar7 - 1);
        uVar12 = uVar11 - 1;
        lVar10 = lVar10 + -4;
        uVar5 = uVar11 & 0xfffffff0;
        uVar11 = uVar12;
      } while ((uVar5 != 0) || (uVar9 = uVar7, (0xfL << (bVar4 & 0x3f) & uVar6) == 0));
      this->precision = uVar9;
      return;
    }
  }
  setBcdToZero(this);
  return;
}

Assistant:

void DecimalQuantity::compact() {
    if (usingBytes) {
        int32_t delta = 0;
        for (; delta < precision && fBCD.bcdBytes.ptr[delta] == 0; delta++);
        if (delta == precision) {
            // Number is zero
            setBcdToZero();
            return;
        } else {
            // Remove trailing zeros
            shiftRight(delta);
        }

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && fBCD.bcdBytes.ptr[leading] == 0; leading--);
        precision = leading + 1;

        // Switch storage mechanism if possible
        if (precision <= 16) {
            switchStorage();
        }

    } else {
        if (fBCD.bcdLong == 0L) {
            // Number is zero
            setBcdToZero();
            return;
        }

        // Compact the number (remove trailing zeros)
        // TODO: Use a more efficient algorithm here and below. There is a logarithmic one.
        int32_t delta = 0;
        for (; delta < precision && getDigitPos(delta) == 0; delta++);
        fBCD.bcdLong >>= delta * 4;
        scale += delta;

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && getDigitPos(leading) == 0; leading--);
        precision = leading + 1;
    }
}